

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

void prvTidyParseDefList(TidyDocImpl *doc,Node *list,GetTokenMode mode)

{
  TidyTagId TVar1;
  uint uVar2;
  Lexer *pLVar3;
  Dict *pDVar4;
  Dict *pDVar5;
  Bool BVar6;
  NodeType NVar7;
  Node *node;
  Node **ppNVar8;
  uint code;
  Node *pNVar9;
  Node *parent;
  Node *pNVar10;
  
  if ((list->tag->model & 1) != 0) {
    return;
  }
  pLVar3 = doc->lexer;
  pLVar3->insert = (IStack *)0x0;
  node = prvTidyGetToken(doc,IgnoreWhitespace);
joined_r0x0013fef6:
  if (node == (Node *)0x0) {
LAB_0014016c:
    node = (Node *)0x0;
    code = 0x25a;
LAB_00140179:
    prvTidyReport(doc,list,node,code);
    return;
  }
  do {
    if ((node->tag == list->tag) && (node->type == EndTag)) {
      prvTidyFreeNode(doc,node);
      list->closed = yes;
      return;
    }
    BVar6 = InsertMisc(list,node);
    if (BVar6 == no) {
      BVar6 = prvTidynodeIsText(node);
      if (BVar6 != no) {
        prvTidyUngetToken(doc);
        node = prvTidyInferredTag(doc,TidyTag_DT);
        prvTidyReport(doc,list,node,0x261);
      }
      pDVar4 = node->tag;
      if (pDVar4 != (Dict *)0x0) {
        NVar7 = node->type;
        if (NVar7 == EndTag) {
          pNVar9 = list;
          if (pDVar4->id != TidyTag_FORM) {
            while (pNVar9 = pNVar9->parent, pNVar9 != (Node *)0x0) {
              pDVar5 = pNVar9->tag;
              if ((pDVar5 != (Dict *)0x0) && (pDVar5->id == TidyTag_BODY)) goto LAB_0014001d;
              if (pDVar4 == pDVar5) {
                prvTidyReport(doc,list,node,0x259);
                prvTidyUngetToken(doc);
                return;
              }
            }
            if (node != (Node *)0x0) goto LAB_0013ffb3;
            goto LAB_0013ffc8;
          }
          *(byte *)&doc->badForm = (byte)doc->badForm | 1;
        }
        else {
LAB_0013ffb3:
          TVar1 = pDVar4->id;
          if ((TVar1 != TidyTag_DD) && (TVar1 != TidyTag_DT)) {
            if (TVar1 == TidyTag_CENTER) break;
LAB_0013ffc8:
            prvTidyUngetToken(doc);
            uVar2 = node->tag->model;
            if ((uVar2 & 0x18) == 0) {
              code = 0x27e;
              goto LAB_00140179;
            }
            if (((uVar2 & 0x10) == 0) && (pLVar3->excludeBlocks != no)) {
              return;
            }
            node = prvTidyInferredTag(doc,TidyTag_DD);
            prvTidyReport(doc,list,node,0x261);
            NVar7 = node->type;
          }
          if (NVar7 != EndTag) {
            node->parent = list;
            pNVar9 = list->last;
            node->prev = pNVar9;
            ppNVar8 = &pNVar9->next;
            if (pNVar9 == (Node *)0x0) {
              ppNVar8 = &list->content;
            }
            *ppNVar8 = node;
            list->last = node;
            ParseTag(doc,node,IgnoreWhitespace);
            goto LAB_0014003d;
          }
        }
      }
LAB_0014001d:
      prvTidyReport(doc,list,node,0x235);
      prvTidyFreeNode(doc,node);
    }
LAB_0014003d:
    node = prvTidyGetToken(doc,IgnoreWhitespace);
    if (node == (Node *)0x0) goto LAB_0014016c;
  } while( true );
  pNVar9 = list->content;
  pNVar10 = list->parent;
  node->parent = pNVar10;
  if (pNVar9 == (Node *)0x0) {
    node->next = list;
    node->prev = list->prev;
    list->prev = node;
    if (node->prev != (Node *)0x0) {
      node->prev->next = node;
    }
    if (pNVar10->content == list) {
      pNVar10->content = node;
    }
  }
  else {
    if ((pNVar10 == (Node *)0x0) || (pNVar10->last != list)) {
      pNVar9 = list->next;
      node->next = pNVar9;
      if (pNVar9 != (Node *)0x0) {
        ppNVar8 = &pNVar9->prev;
        goto LAB_001400df;
      }
    }
    else {
      ppNVar8 = &pNVar10->last;
LAB_001400df:
      *ppNVar8 = node;
      pNVar10 = node->parent;
    }
    list->next = node;
    node->prev = list;
  }
  pLVar3->excludeBlocks = no;
  ParseTag(doc,node,mode);
  pLVar3->excludeBlocks = yes;
  if (pNVar10->last != node) goto LAB_00140156;
  list = prvTidyInferredTag(doc,TidyTag_DL);
  pNVar9 = node->parent;
  list->parent = pNVar9;
  if ((pNVar9 == (Node *)0x0) || (pNVar9->last != node)) {
    pNVar9 = node->next;
    list->next = pNVar9;
    if (pNVar9 != (Node *)0x0) {
      ppNVar8 = &pNVar9->prev;
      goto LAB_0014014b;
    }
  }
  else {
    ppNVar8 = &pNVar9->last;
LAB_0014014b:
    *ppNVar8 = list;
  }
  node->next = list;
  list->prev = node;
LAB_00140156:
  node = prvTidyGetToken(doc,IgnoreWhitespace);
  goto joined_r0x0013fef6;
}

Assistant:

void TY_(ParseDefList)(TidyDocImpl* doc, Node *list, GetTokenMode mode)
{
    Lexer* lexer = doc->lexer;
    Node *node, *parent;

    if (list->tag->model & CM_EMPTY)
        return;

    lexer->insert = NULL;  /* defer implicit inline start tags */

    while ((node = TY_(GetToken)( doc, IgnoreWhitespace)) != NULL)
    {
        if (node->tag == list->tag && node->type == EndTag)
        {
            TY_(FreeNode)( doc, node);
            list->closed = yes;
            return;
        }

        /* deal with comments etc. */
        if (InsertMisc(list, node))
            continue;

        if (TY_(nodeIsText)(node))
        {
            TY_(UngetToken)( doc );
            node = TY_(InferredTag)(doc, TidyTag_DT);
            TY_(Report)(doc, list, node, MISSING_STARTTAG);
        }

        if (node->tag == NULL)
        {
            TY_(Report)(doc, list, node, DISCARDING_UNEXPECTED);
            TY_(FreeNode)( doc, node);
            continue;
        }

        /* 
          if this is the end tag for an ancestor element
          then infer end tag for this element
        */
        if (node->type == EndTag)
        {
            Bool discardIt = no;
            if ( nodeIsFORM(node) )
            {
                BadForm( doc );
                TY_(Report)(doc, list, node, DISCARDING_UNEXPECTED);
                TY_(FreeNode)( doc, node );
                continue;
            }

            for (parent = list->parent;
                    parent != NULL; parent = parent->parent)
            {
               /* Do not match across BODY to avoid infinite loop
                  between ParseBody and this parser,
                  See http://tidy.sf.net/bug/1098012. */
                if (nodeIsBODY(parent))
                {
                    discardIt = yes;
                    break;
                }
                if (node->tag == parent->tag)
                {
                    TY_(Report)(doc, list, node, MISSING_ENDTAG_BEFORE);

                    TY_(UngetToken)( doc );
                    return;
                }
            }
            if (discardIt)
            {
                TY_(Report)(doc, list, node, DISCARDING_UNEXPECTED);
                TY_(FreeNode)( doc, node);
                continue;
            }
        }

        /* center in a dt or a dl breaks the dl list in two */
        if ( nodeIsCENTER(node) )
        {
            if (list->content)
                TY_(InsertNodeAfterElement)(list, node);
            else /* trim empty dl list */
            {
                TY_(InsertNodeBeforeElement)(list, node);
            }

            /* #426885 - fix by Glenn Carroll 19 Apr 00, and
                         Gary Dechaines 11 Aug 00 */
            /* ParseTag can destroy node, if it finds that
             * this <center> is followed immediately by </center>.
             * It's awkward but necessary to determine if this
             * has happened.
             */
            parent = node->parent;

            /* and parse contents of center */
            lexer->excludeBlocks = no;
            ParseTag( doc, node, mode);
            lexer->excludeBlocks = yes;

            /* now create a new dl element,
             * unless node has been blown away because the
             * center was empty, as above.
             */
            if (parent->last == node)
            {
                list = TY_(InferredTag)(doc, TidyTag_DL);
                TY_(InsertNodeAfterElement)(node, list);
            }
            continue;
        }

        if ( !(nodeIsDT(node) || nodeIsDD(node)) )
        {
            TY_(UngetToken)( doc );

            if (!(node->tag->model & (CM_BLOCK | CM_INLINE)))
            {
                TY_(Report)(doc, list, node, TAG_NOT_ALLOWED_IN);
                return;
            }

            /* if DD appeared directly in BODY then exclude blocks */
            if (!(node->tag->model & CM_INLINE) && lexer->excludeBlocks)
                return;

            node = TY_(InferredTag)(doc, TidyTag_DD);
            TY_(Report)(doc, list, node, MISSING_STARTTAG);
        }

        if (node->type == EndTag)
        {
            TY_(Report)(doc, list, node, DISCARDING_UNEXPECTED);
            TY_(FreeNode)( doc, node);
            continue;
        }
        
        /* node should be <DT> or <DD>*/
        TY_(InsertNodeAtEnd)(list, node);
        ParseTag( doc, node, IgnoreWhitespace);
    }

    TY_(Report)(doc, list, node, MISSING_ENDTAG_FOR);
}